

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O3

cmCommand * __thiscall cmConfigureFileCommand::Clone(cmConfigureFileCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x80);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmConfigureFileCommand_006856d8;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)(pcVar1 + 1));
  pcVar1[1].Makefile = (cmMakefile *)&pcVar1[1].Error._M_string_length;
  pcVar1[1].Error._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pcVar1[1].Error._M_string_length = 0;
  *(cmMakefile ***)((long)&pcVar1[1].Error.field_2 + 8) = &pcVar1[2].Makefile;
  pcVar1[2]._vptr_cmCommand = (_func_int **)0x0;
  *(undefined1 *)&pcVar1[2].Makefile = 0;
  return pcVar1;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmConfigureFileCommand; }